

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O0

size_t showHelpIntro(poptContext con,FILE *fp)

{
  char *pcVar1;
  size_t sVar2;
  char *local_48;
  char *local_40;
  char *fn;
  optionStackEntry *os;
  size_t len;
  char *usage_str;
  FILE *fp_local;
  poptContext con_local;
  
  os = (optionStackEntry *)strlen("Usage:");
  POPT_fprintf(fp,"%s","Usage:");
  if ((con->flags & 2) == 0) {
    if (con->optionStack[0].argv == (poptArgv)0x0) {
      local_48 = (char *)0x0;
    }
    else {
      local_48 = *con->optionStack[0].argv;
    }
    local_40 = local_48;
    if (local_48 == (char *)0x0) {
      return (size_t)os;
    }
    pcVar1 = strchr(local_48,0x2f);
    if (pcVar1 != (char *)0x0) {
      local_40 = strrchr(local_48,0x2f);
      local_40 = local_40 + 1;
    }
    fprintf((FILE *)fp," %s",local_40);
    sVar2 = strlen(local_40);
    os = (optionStackEntry *)((long)&os->argc + sVar2 + 1);
  }
  return (size_t)os;
}

Assistant:

static size_t showHelpIntro(poptContext con, FILE * fp)
{
    const char *usage_str = POPT_("Usage:");
    size_t len = strlen(usage_str);
    POPT_fprintf(fp, "%s", usage_str);

    if (!(con->flags & POPT_CONTEXT_KEEP_FIRST)) {
	struct optionStackEntry * os = con->optionStack;
	const char * fn = (os->argv ? os->argv[0] : NULL);
	if (fn == NULL) return len;
	if (strchr(fn, '/')) fn = strrchr(fn, '/') + 1;
	/* XXX POPT_fprintf not needed for argv[0] display. */
	fprintf(fp, " %s", fn);
	len += strlen(fn) + 1;
    }

    return len;
}